

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> * __thiscall
amrex::DistributionMapping::getOwnerShip(DistributionMapping *this)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  iterator __position;
  uint in_EAX;
  int iVar4;
  int iVar5;
  int iVar6;
  int i;
  undefined8 uStack_38;
  
  peVar3 = (this->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((*(_Bit_type **)
        &(peVar3->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start ==
       (((_Bit_iterator *)
        ((long)&(peVar3->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p) &&
     (*(uint *)((long)&(peVar3->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data + 0x18) == 0)) {
    iVar1 = *(int *)(ParallelContext::frames + 0xc);
    uStack_38 = (ulong)in_EAX;
    iVar6 = (int)((ulong)((long)*(pointer *)
                                 ((long)&(peVar3->m_pmap).super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                         - *(long *)&(peVar3->m_pmap).super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl) >> 2);
    if (0 < iVar6) {
      iVar5 = 0;
      do {
        peVar3 = (this->m_ref).
                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar2 = *(int *)(*(long *)&(peVar3->m_pmap).super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl +
                        (long)iVar5 * 4);
        if (iVar2 < 0) {
          iVar4 = 0;
        }
        else {
          iVar4 = iVar2 - iVar2 % (int)ParallelDescriptor::m_Team._4_4_;
        }
        if (ParallelDescriptor::m_Team._12_4_ == iVar4) {
          __position._M_current =
               *(pointer *)
                ((long)&(peVar3->m_index_array).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
          if (__position._M_current ==
              *(pointer *)
               ((long)&(peVar3->m_index_array).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&peVar3->m_index_array,__position,
                       (int *)((long)&uStack_38 + 4));
          }
          else {
            *__position._M_current = iVar5;
            *(int **)((long)&(peVar3->m_index_array).super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) =
                 __position._M_current + 1;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (&((this->m_ref).
                       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_ownership,iVar1 == iVar2);
        }
        iVar5 = uStack_38._4_4_ + 1;
        uStack_38 = CONCAT44(iVar5,(undefined4)uStack_38);
      } while (iVar5 < iVar6);
    }
  }
  return &((this->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_ownership;
}

Assistant:

const std::vector<bool>&
DistributionMapping::getOwnerShip ()
{
    if (m_ref->m_ownership.empty())
    {
        int myProc = ParallelDescriptor::MyProc();

        for(int i = 0, N = m_ref->m_pmap.size(); i < N; ++i) {
            int rank = m_ref->m_pmap[i];
            if (ParallelDescriptor::sameTeam(rank)) {
                // If Team is not used (i.e., team size == 1), distributionMap[i] == myProc
                m_ref->m_index_array.push_back(i);
                m_ref->m_ownership.push_back(myProc == rank);
            }
        }
    }
    return m_ref->m_ownership;
}